

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void idr_register(idr *idr,isoent *isoent,int weight,int noff)

{
  int iVar1;
  archive_rb_node *paVar2;
  archive_rb_node *paVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  void *in_RSI;
  archive_rb_tree *in_RDI;
  idrent *n;
  idrent *idrent;
  
  paVar2 = in_RDI->rbt_root;
  iVar1 = *(int *)((long)&in_RDI[2].rbt_ops + 4);
  *(int *)((long)&in_RDI[2].rbt_ops + 4) = iVar1 + 1;
  paVar2 = (archive_rb_node *)((long)paVar2 + (long)iVar1 * 0x40);
  paVar2[1].rb_nodes[1] = (archive_rb_node *)0x0;
  paVar2[1].rb_nodes[0] = (archive_rb_node *)0x0;
  paVar2[1].rb_info = (uintptr_t)in_RSI;
  *(undefined4 *)paVar2[2].rb_nodes = in_EDX;
  *(undefined4 *)((long)paVar2[2].rb_nodes + 4) = in_ECX;
  *(undefined4 *)(paVar2[2].rb_nodes + 1) = 0;
  iVar1 = __archive_rb_tree_insert_node((archive_rb_tree *)idrent,&n->rbnode);
  if ((iVar1 == 0) &&
     (paVar3 = __archive_rb_tree_find_node(in_RDI,in_RSI), paVar3 != (archive_rb_node *)0x0)) {
    paVar2[1].rb_nodes[1] = paVar3;
    (in_RDI[2].rbt_root)->rb_nodes[0] = paVar2;
    in_RDI[2].rbt_root = paVar2 + 1;
  }
  return;
}

Assistant:

static void
idr_register(struct idr *idr, struct isoent *isoent, int weight, int noff)
{
	struct idrent *idrent, *n;

	idrent = &(idr->idrent_pool[idr->pool_idx++]);
	idrent->wnext = idrent->avail = NULL;
	idrent->isoent = isoent;
	idrent->weight = weight;
	idrent->noff = noff;
	idrent->rename_num = 0;

	if (!__archive_rb_tree_insert_node(&(idr->rbtree), &(idrent->rbnode))) {
		n = (struct idrent *)__archive_rb_tree_find_node(
		    &(idr->rbtree), idrent->isoent);
		if (n != NULL) {
			/* this `idrent' needs to rename. */
			idrent->avail = n;
			*idr->wait_list.last = idrent;
			idr->wait_list.last = &(idrent->wnext);
		}
	}
}